

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_soft.c
# Opt level: O3

void shader_grad_any_first
               (uintptr_t state,int start_x,int start_y,ALLEGRO_VERTEX *v1,ALLEGRO_VERTEX *v2)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  
  fVar5 = (v1->color).r;
  fVar6 = (v1->color).g;
  fVar7 = (v1->color).b;
  fVar8 = (v1->color).a;
  uVar1 = v1->x;
  uVar3 = v1->y;
  uVar2 = v2->x;
  uVar4 = v2->y;
  fVar11 = (float)uVar2 - (float)uVar1;
  fVar12 = (float)uVar4 - (float)uVar3;
  fVar14 = fVar11 * fVar11 + fVar12 * fVar12;
  fVar13 = 0.0;
  if ((fVar14 != 0.0) || (NAN(fVar14))) {
    fVar13 = (((float)start_x - (float)uVar1) * fVar11 + ((float)start_y - (float)uVar3) * fVar12) /
             fVar14;
  }
  else {
    fVar14 = 0.0001;
  }
  fVar11 = ABS(fVar11);
  fVar12 = ABS(fVar12);
  fVar15 = fVar11;
  if (fVar11 <= fVar12) {
    fVar15 = fVar12;
  }
  fVar15 = fVar15 / fVar14;
  fVar14 = (fVar11 + fVar12) / fVar14;
  fVar11 = (v2->color).r - fVar5;
  fVar12 = (v2->color).g - fVar6;
  fVar9 = (v2->color).b - fVar7;
  fVar10 = (v2->color).a - fVar8;
  *(float *)state = fVar13 * fVar11 + fVar5;
  *(float *)(state + 4) = fVar13 * fVar12 + fVar6;
  *(float *)(state + 8) = fVar13 * fVar9 + fVar7;
  *(float *)(state + 0xc) = fVar13 * fVar10 + fVar8;
  *(float *)(state + 0x10) = fVar15 * fVar11;
  *(float *)(state + 0x14) = fVar15 * fVar12;
  *(float *)(state + 0x18) = fVar15 * fVar9;
  *(float *)(state + 0x1c) = fVar15 * fVar10;
  *(float *)(state + 0x20) = fVar14 * fVar11;
  *(float *)(state + 0x24) = fVar14 * fVar12;
  *(float *)(state + 0x28) = fVar14 * fVar9;
  *(float *)(state + 0x2c) = fVar14 * fVar10;
  return;
}

Assistant:

static void shader_grad_any_first(uintptr_t state, int start_x, int start_y, ALLEGRO_VERTEX* v1, ALLEGRO_VERTEX* v2)
{
   float param;
   float minor_delta_param;
   float major_delta_param;
   state_grad_any_2d* st = (state_grad_any_2d*)state;
   ALLEGRO_COLOR diff, v1c, v2c;

   v1c = v1->color;
   v2c = v2->color;

   get_interpolation_parameters(start_x, start_y, v1, v2, &param, &minor_delta_param, &major_delta_param);
  
   diff.a = v2c.a - v1c.a;
   diff.r = v2c.r - v1c.r;
   diff.g = v2c.g - v1c.g;
   diff.b = v2c.b - v1c.b;
   
   st->solid.color.a = v1c.a + diff.a * param;
   st->solid.color.r = v1c.r + diff.r * param;
   st->solid.color.g = v1c.g + diff.g * param;
   st->solid.color.b = v1c.b + diff.b * param;
   
   st->minor_color.a = diff.a * minor_delta_param;
   st->minor_color.r = diff.r * minor_delta_param;
   st->minor_color.g = diff.g * minor_delta_param;
   st->minor_color.b = diff.b * minor_delta_param;
   
   st->major_color.a = diff.a * major_delta_param;
   st->major_color.r = diff.r * major_delta_param;
   st->major_color.g = diff.g * major_delta_param;
   st->major_color.b = diff.b * major_delta_param;
}